

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pushdown_set_operation.cpp
# Opt level: O2

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::FilterPushdown::PushdownSetOperation
          (FilterPushdown *this,
          unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
          *op)

{
  vector<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>,_true>
  *this_00;
  LogicalOperatorType LVar1;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var2;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var3;
  templated_unique_single_t tVar4;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var5;
  LogicalSetOperation *setop;
  pointer pLVar6;
  reference pvVar7;
  reference pvVar8;
  pointer pFVar9;
  pointer pEVar10;
  type pFVar11;
  type pEVar12;
  LogicalProjection *pLVar13;
  InternalException *pIVar14;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> *in_RDX;
  ulong __n;
  templated_unique_single_t right_filter;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_2c0;
  LogicalOperator *local_2b8;
  LogicalOperator *local_2b0;
  __node_base local_2a8;
  vector<duckdb::ColumnBinding,_true> right_bindings;
  vector<duckdb::ColumnBinding,_true> left_bindings;
  FilterPushdown left_pushdown;
  FilterPushdown right_pushdown;
  
  setop = (LogicalSetOperation *)
          unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
          operator->(in_RDX);
  pLVar6 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->(in_RDX);
  pvVar7 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
           ::get<true>(&pLVar6->children,0);
  pLVar6 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->(pvVar7);
  (*pLVar6->_vptr_LogicalOperator[2])(&left_bindings,pLVar6);
  pLVar6 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->(in_RDX);
  pvVar7 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
           ::get<true>(&pLVar6->children,1);
  pLVar6 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->(pvVar7);
  (*pLVar6->_vptr_LogicalOperator[2])(&right_bindings,pLVar6);
  if ((long)left_bindings.
            super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
            super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)left_bindings.
            super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
            super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
            _M_impl.super__Vector_impl_data._M_start !=
      (long)right_bindings.
            super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
            super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)right_bindings.
            super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
            super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
            _M_impl.super__Vector_impl_data._M_start) {
    pIVar14 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&left_pushdown,
               "Filter pushdown - set operation LHS and RHS have incompatible counts",
               (allocator *)&right_pushdown);
    InternalException::InternalException(pIVar14,(string *)&left_pushdown);
    __cxa_throw(pIVar14,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  local_2a8._M_nxt = (_Hash_node_base *)&left_pushdown;
  FilterPushdown((FilterPushdown *)local_2a8._M_nxt,
                 (Optimizer *)
                 (op->
                 super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                 )._M_t.
                 super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                 .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl,
                 *(bool *)&op[0x20].
                           super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                           ._M_t.
                           super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                           .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl);
  FilterPushdown(&right_pushdown,
                 (Optimizer *)
                 (op->
                 super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                 )._M_t.
                 super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                 .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl,
                 *(bool *)&op[0x20].
                           super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                           ._M_t.
                           super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                           .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl);
  this_00 = (vector<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>,_true>
             *)(op + 0x21);
  local_2a8._M_nxt = local_2a8._M_nxt + 0x21;
  for (__n = 0; __n < (ulong)((long)op[0x22].
                                    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                                    ._M_t.
                                    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                                    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>.
                                    _M_head_impl -
                              (long)op[0x21].
                                    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                                    ._M_t.
                                    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                                    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>.
                                    _M_head_impl >> 3); __n = __n + 1) {
    make_uniq<duckdb::FilterPushdown::Filter>();
    pvVar8 = vector<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>,_true>
             ::get<true>(this_00,__n);
    pFVar9 = unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>
             ::operator->(pvVar8);
    pEVar10 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator->(&pFVar9->filter);
    (*(pEVar10->super_BaseExpression)._vptr_BaseExpression[0x11])(&local_2c0,pEVar10);
    pFVar9 = unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>
             ::operator->((unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>
                           *)&right_filter.
                              super_unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>_>
                         );
    _Var5._M_head_impl = local_2c0._M_head_impl;
    local_2c0._M_head_impl = (Expression *)0x0;
    _Var2._M_head_impl =
         (pFVar9->filter).
         super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
         super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (pFVar9->filter).super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
    _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = _Var5._M_head_impl;
    if (_Var2._M_head_impl != (Expression *)0x0) {
      (**(code **)(*(long *)&(_Var2._M_head_impl)->super_BaseExpression + 8))();
      if (local_2c0._M_head_impl != (Expression *)0x0) {
        (*((local_2c0._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
    }
    pvVar8 = vector<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>,_true>
             ::get<true>(this_00,__n);
    pFVar11 = unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>
              ::operator*(pvVar8);
    pvVar8 = vector<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>,_true>
             ::get<true>(this_00,__n);
    pFVar9 = unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>
             ::operator->(pvVar8);
    pEVar12 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator*(&pFVar9->filter);
    ReplaceSetOpBindings(&left_bindings,pFVar11,pEVar12,setop);
    pFVar11 = unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>
              ::operator*((unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>
                           *)&right_filter.
                              super_unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>_>
                         );
    pFVar9 = unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>
             ::operator->((unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>
                           *)&right_filter.
                              super_unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>_>
                         );
    pEVar12 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator*(&pFVar9->filter);
    ReplaceSetOpBindings(&right_bindings,pFVar11,pEVar12,setop);
    pvVar8 = vector<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>,_true>
             ::get<true>(this_00,__n);
    pFVar9 = unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>
             ::operator->(pvVar8);
    Filter::ExtractBindings(pFVar9);
    pFVar9 = unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>
             ::operator->((unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>
                           *)&right_filter.
                              super_unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>_>
                         );
    Filter::ExtractBindings(pFVar9);
    pvVar8 = vector<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>,_true>
             ::get<true>(this_00,__n);
    ::std::
    vector<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,std::default_delete<duckdb::FilterPushdown::Filter>,true>,std::allocator<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,std::default_delete<duckdb::FilterPushdown::Filter>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,std::default_delete<duckdb::FilterPushdown::Filter>,true>>
              ((vector<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,std::default_delete<duckdb::FilterPushdown::Filter>,true>,std::allocator<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,std::default_delete<duckdb::FilterPushdown::Filter>,true>>>
                *)local_2a8._M_nxt,pvVar8);
    ::std::
    vector<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,std::default_delete<duckdb::FilterPushdown::Filter>,true>,std::allocator<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,std::default_delete<duckdb::FilterPushdown::Filter>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,std::default_delete<duckdb::FilterPushdown::Filter>,true>>
              ((vector<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,std::default_delete<duckdb::FilterPushdown::Filter>,true>,std::allocator<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,std::default_delete<duckdb::FilterPushdown::Filter>,true>>>
                *)&right_pushdown.filters,
               (unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>
                *)&right_filter.
                   super_unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>_>
              );
    ::std::
    unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>_>
    ::~unique_ptr(&right_filter.
                   super_unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>_>
                 );
  }
  pLVar6 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->(in_RDX);
  pvVar7 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
           ::get<true>(&pLVar6->children,0);
  local_2b0 = (pvVar7->
              super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
              )._M_t.
              super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
              ._M_t.
              super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
              .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
  (pvVar7->super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
  ._M_t.
  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
  super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0;
  Rewrite((FilterPushdown *)&right_filter,
          (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> *
          )&left_pushdown);
  pLVar6 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->(in_RDX);
  pvVar7 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
           ::get<true>(&pLVar6->children,0);
  tVar4 = right_filter;
  right_filter.
  super_unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::FilterPushdown::Filter_*,_std::default_delete<duckdb::FilterPushdown::Filter>_>
  .super__Head_base<0UL,_duckdb::FilterPushdown::Filter_*,_false>._M_head_impl =
       (unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>_>
        )(__uniq_ptr_data<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true,_true>
          )0x0;
  _Var3._M_head_impl =
       (pvVar7->
       super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
       _M_t.
       super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
       .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
  (pvVar7->super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
  ._M_t.
  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
  super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
       (LogicalOperator *)
       tVar4.
       super_unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::FilterPushdown::Filter_*,_std::default_delete<duckdb::FilterPushdown::Filter>_>
       .super__Head_base<0UL,_duckdb::FilterPushdown::Filter_*,_false>._M_head_impl;
  if (_Var3._M_head_impl != (LogicalOperator *)0x0) {
    (**(code **)((long)(_Var3._M_head_impl)->_vptr_LogicalOperator + 8))();
  }
  if (right_filter.
      super_unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::FilterPushdown::Filter_*,_std::default_delete<duckdb::FilterPushdown::Filter>_>
      .super__Head_base<0UL,_duckdb::FilterPushdown::Filter_*,_false>._M_head_impl !=
      (__uniq_ptr_data<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)right_filter.
                          super_unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>_>
                          ._M_t.
                          super___uniq_ptr_impl<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_duckdb::FilterPushdown::Filter_*,_std::default_delete<duckdb::FilterPushdown::Filter>_>
                          .super__Head_base<0UL,_duckdb::FilterPushdown::Filter_*,_false>.
                          _M_head_impl + 8))();
  }
  right_filter.
  super_unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::FilterPushdown::Filter_*,_std::default_delete<duckdb::FilterPushdown::Filter>_>
  .super__Head_base<0UL,_duckdb::FilterPushdown::Filter_*,_false>._M_head_impl =
       (unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>_>
        )(__uniq_ptr_data<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true,_true>
          )0x0;
  if (local_2b0 != (LogicalOperator *)0x0) {
    (*local_2b0->_vptr_LogicalOperator[1])();
  }
  local_2b0 = (LogicalOperator *)0x0;
  pLVar6 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->(in_RDX);
  pvVar7 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
           ::get<true>(&pLVar6->children,1);
  local_2b8 = (pvVar7->
              super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
              )._M_t.
              super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
              ._M_t.
              super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
              .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
  (pvVar7->super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
  ._M_t.
  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
  super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0;
  Rewrite((FilterPushdown *)&right_filter,
          (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> *
          )&right_pushdown);
  pLVar6 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->(in_RDX);
  pvVar7 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
           ::get<true>(&pLVar6->children,1);
  tVar4 = right_filter;
  right_filter.
  super_unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::FilterPushdown::Filter_*,_std::default_delete<duckdb::FilterPushdown::Filter>_>
  .super__Head_base<0UL,_duckdb::FilterPushdown::Filter_*,_false>._M_head_impl =
       (unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>_>
        )(__uniq_ptr_data<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true,_true>
          )0x0;
  _Var3._M_head_impl =
       (pvVar7->
       super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
       _M_t.
       super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
       .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
  (pvVar7->super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
  ._M_t.
  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
  super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
       (LogicalOperator *)
       tVar4.
       super_unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::FilterPushdown::Filter_*,_std::default_delete<duckdb::FilterPushdown::Filter>_>
       .super__Head_base<0UL,_duckdb::FilterPushdown::Filter_*,_false>._M_head_impl;
  if (_Var3._M_head_impl != (LogicalOperator *)0x0) {
    (**(code **)((long)(_Var3._M_head_impl)->_vptr_LogicalOperator + 8))();
  }
  if (right_filter.
      super_unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::FilterPushdown::Filter_*,_std::default_delete<duckdb::FilterPushdown::Filter>_>
      .super__Head_base<0UL,_duckdb::FilterPushdown::Filter_*,_false>._M_head_impl !=
      (__uniq_ptr_data<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)right_filter.
                          super_unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>_>
                          ._M_t.
                          super___uniq_ptr_impl<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_duckdb::FilterPushdown::Filter_*,_std::default_delete<duckdb::FilterPushdown::Filter>_>
                          .super__Head_base<0UL,_duckdb::FilterPushdown::Filter_*,_false>.
                          _M_head_impl + 8))();
  }
  right_filter.
  super_unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::FilterPushdown::Filter_*,_std::default_delete<duckdb::FilterPushdown::Filter>_>
  .super__Head_base<0UL,_duckdb::FilterPushdown::Filter_*,_false>._M_head_impl =
       (unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>_>
        )(__uniq_ptr_data<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true,_true>
          )0x0;
  if (local_2b8 != (LogicalOperator *)0x0) {
    (*local_2b8->_vptr_LogicalOperator[1])();
  }
  local_2b8 = (LogicalOperator *)0x0;
  pLVar6 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->(in_RDX);
  pvVar7 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
           ::get<true>(&pLVar6->children,0);
  pLVar6 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->(pvVar7);
  LVar1 = pLVar6->type;
  pLVar6 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->(in_RDX);
  pvVar7 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
           ::get<true>(&pLVar6->children,1);
  pLVar6 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->(pvVar7);
  if ((LVar1 == LOGICAL_EMPTY_RESULT) && (pLVar6->type == LOGICAL_EMPTY_RESULT)) {
    make_uniq<duckdb::LogicalEmptyResult,duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>
              ((duckdb *)&right_filter,in_RDX);
LAB_01a7130c:
    this->optimizer =
         (Optimizer *)
         right_filter.
         super_unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::FilterPushdown::Filter_*,_std::default_delete<duckdb::FilterPushdown::Filter>_>
         .super__Head_base<0UL,_duckdb::FilterPushdown::Filter_*,_false>._M_head_impl;
  }
  else {
    if ((LVar1 == LOGICAL_EMPTY_RESULT) && (setop->setop_all == true)) {
      pLVar6 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               ::operator->(in_RDX);
      if (pLVar6->type - 0x4c < 2) {
        make_uniq<duckdb::LogicalEmptyResult,duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>
                  ((duckdb *)&right_filter,in_RDX);
        goto LAB_01a7130c;
      }
      if (pLVar6->type != LOGICAL_UNION) {
        pIVar14 = (InternalException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&right_filter,"Unsupported set operation",(allocator *)&local_2c0);
        InternalException::InternalException(pIVar14,(string *)&right_filter);
        __cxa_throw(pIVar14,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      pLVar6 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               ::operator->(in_RDX);
      pvVar7 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
               ::get<true>(&pLVar6->children,1);
      pLVar6 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               ::operator->(pvVar7);
      if (pLVar6->type == LOGICAL_PROJECTION) {
        pLVar6 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                 ::operator->(in_RDX);
        pvVar7 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                 ::get<true>(&pLVar6->children,1);
        pLVar6 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                 ::operator->(pvVar7);
        pLVar13 = LogicalOperator::Cast<duckdb::LogicalProjection>(pLVar6);
        pLVar13->table_index = setop->table_index;
        pLVar6 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                 ::operator->(in_RDX);
        pvVar7 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                 ::get<true>(&pLVar6->children,1);
LAB_01a71479:
        this->optimizer =
             (Optimizer *)
             (pvVar7->
             super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
             )._M_t.
             super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
             .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
        (pvVar7->
        super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
        _M_t.
        super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
        .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
             (LogicalOperator *)0x0;
        goto LAB_01a7149d;
      }
    }
    else if ((pLVar6->type == LOGICAL_EMPTY_RESULT) && (setop->setop_all == true)) {
      pLVar6 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               ::operator->(in_RDX);
      if (1 < pLVar6->type - 0x4b) {
        if (pLVar6->type != LOGICAL_INTERSECT) {
          pIVar14 = (InternalException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&right_filter,"Unsupported set operation",(allocator *)&local_2c0);
          InternalException::InternalException(pIVar14,(string *)&right_filter);
          __cxa_throw(pIVar14,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
        make_uniq<duckdb::LogicalEmptyResult,duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>
                  ((duckdb *)&right_filter,in_RDX);
        goto LAB_01a7130c;
      }
      pLVar6 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               ::operator->(in_RDX);
      pvVar7 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
               ::get<true>(&pLVar6->children,0);
      pLVar6 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               ::operator->(pvVar7);
      if (pLVar6->type == LOGICAL_PROJECTION) {
        pLVar6 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                 ::operator->(in_RDX);
        pvVar7 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                 ::get<true>(&pLVar6->children,0);
        pLVar6 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                 ::operator->(pvVar7);
        pLVar13 = LogicalOperator::Cast<duckdb::LogicalProjection>(pLVar6);
        pLVar13->table_index = setop->table_index;
        pLVar6 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                 ::operator->(in_RDX);
        pvVar7 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                 ::get<true>(&pLVar6->children,0);
        goto LAB_01a71479;
      }
    }
    this->optimizer =
         (Optimizer *)
         (in_RDX->
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    (in_RDX->
    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0;
  }
LAB_01a7149d:
  ~FilterPushdown(&right_pushdown);
  ~FilterPushdown(&left_pushdown);
  ::std::_Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>::~_Vector_base
            ((_Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_> *)
             &right_bindings);
  ::std::_Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>::~_Vector_base
            ((_Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_> *)
             &left_bindings);
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)this;
}

Assistant:

unique_ptr<LogicalOperator> FilterPushdown::PushdownSetOperation(unique_ptr<LogicalOperator> op) {
	D_ASSERT(op->type == LogicalOperatorType::LOGICAL_UNION || op->type == LogicalOperatorType::LOGICAL_EXCEPT ||
	         op->type == LogicalOperatorType::LOGICAL_INTERSECT);
	auto &setop = op->Cast<LogicalSetOperation>();

	D_ASSERT(op->children.size() == 2);
	auto left_bindings = op->children[0]->GetColumnBindings();
	auto right_bindings = op->children[1]->GetColumnBindings();
	if (left_bindings.size() != right_bindings.size()) {
		throw InternalException("Filter pushdown - set operation LHS and RHS have incompatible counts");
	}

	// pushdown into set operation, we can duplicate the condition and pushdown the expressions into both sides
	FilterPushdown left_pushdown(optimizer, convert_mark_joins), right_pushdown(optimizer, convert_mark_joins);
	for (idx_t i = 0; i < filters.size(); i++) {
		// first create a copy of the filter
		auto right_filter = make_uniq<Filter>();
		right_filter->filter = filters[i]->filter->Copy();

		// in the original filter, rewrite references to the result of the union into references to the left_index
		ReplaceSetOpBindings(left_bindings, *filters[i], *filters[i]->filter, setop);
		// in the copied filter, rewrite references to the result of the union into references to the right_index
		ReplaceSetOpBindings(right_bindings, *right_filter, *right_filter->filter, setop);

		// extract bindings again
		filters[i]->ExtractBindings();
		right_filter->ExtractBindings();

		// move the filters into the child pushdown nodes
		left_pushdown.filters.push_back(std::move(filters[i]));
		right_pushdown.filters.push_back(std::move(right_filter));
	}

	op->children[0] = left_pushdown.Rewrite(std::move(op->children[0]));
	op->children[1] = right_pushdown.Rewrite(std::move(op->children[1]));

	bool left_empty = op->children[0]->type == LogicalOperatorType::LOGICAL_EMPTY_RESULT;
	bool right_empty = op->children[1]->type == LogicalOperatorType::LOGICAL_EMPTY_RESULT;
	if (left_empty && right_empty) {
		// both empty: return empty result
		return make_uniq<LogicalEmptyResult>(std::move(op));
	}
	if (left_empty && setop.setop_all) {
		// left child is empty result
		switch (op->type) {
		case LogicalOperatorType::LOGICAL_UNION:
			if (op->children[1]->type == LogicalOperatorType::LOGICAL_PROJECTION) {
				// union with empty left side: return right child
				auto &projection = op->children[1]->Cast<LogicalProjection>();
				projection.table_index = setop.table_index;
				return std::move(op->children[1]);
			}
			break;
		case LogicalOperatorType::LOGICAL_EXCEPT:
			// except: if left child is empty, return empty result
		case LogicalOperatorType::LOGICAL_INTERSECT:
			// intersect: if any child is empty, return empty result itself
			return make_uniq<LogicalEmptyResult>(std::move(op));
		default:
			throw InternalException("Unsupported set operation");
		}
	} else if (right_empty && setop.setop_all) {
		// right child is empty result
		switch (op->type) {
		case LogicalOperatorType::LOGICAL_UNION:
		case LogicalOperatorType::LOGICAL_EXCEPT:
			if (op->children[0]->type == LogicalOperatorType::LOGICAL_PROJECTION) {
				// union or except with empty right child: return left child
				auto &projection = op->children[0]->Cast<LogicalProjection>();
				projection.table_index = setop.table_index;
				return std::move(op->children[0]);
			}
			break;
		case LogicalOperatorType::LOGICAL_INTERSECT:
			// intersect: if any child is empty, return empty result itself
			return make_uniq<LogicalEmptyResult>(std::move(op));
		default:
			throw InternalException("Unsupported set operation");
		}
	}
	return op;
}